

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

int str_upper(lua_State *L)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *p;
  char *s;
  luaL_Buffer b;
  size_t i;
  size_t l;
  lua_State *L_local;
  
  l = (size_t)L;
  pcVar2 = luaL_checklstring(L,1,&i);
  pcVar3 = luaL_buffinitsize((lua_State *)l,(luaL_Buffer *)&s,i);
  for (b.init._1016_8_ = 0; (ulong)b.init._1016_8_ < i; b.init._1016_8_ = b.init._1016_8_ + 1) {
    iVar1 = toupper((uint)(byte)pcVar2[b.init._1016_8_]);
    pcVar3[b.init._1016_8_] = (char)iVar1;
  }
  luaL_pushresultsize((luaL_Buffer *)&s,i);
  return 1;
}

Assistant:

static int str_upper (lua_State *L) {
  size_t l;
  size_t i;
  luaL_Buffer b;
  const char *s = luaL_checklstring(L, 1, &l);
  char *p = luaL_buffinitsize(L, &b, l);
  for (i=0; i<l; i++)
    p[i] = cast_char(toupper(cast_uchar(s[i])));
  luaL_pushresultsize(&b, l);
  return 1;
}